

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl.cc
# Opt level: O0

void __thiscall
google::protobuf::io::FileOutputStream::CopyingFileOutputStream::CopyingFileOutputStream
          (CopyingFileOutputStream *this,int file_descriptor)

{
  int file_descriptor_local;
  CopyingFileOutputStream *this_local;
  
  CopyingOutputStream::CopyingOutputStream(&this->super_CopyingOutputStream);
  (this->super_CopyingOutputStream)._vptr_CopyingOutputStream =
       (_func_int **)&PTR__CopyingFileOutputStream_00412918;
  this->file_ = file_descriptor;
  this->close_on_delete_ = false;
  this->is_closed_ = false;
  this->errno_ = 0;
  return;
}

Assistant:

FileOutputStream::CopyingFileOutputStream::CopyingFileOutputStream(
    int file_descriptor)
  : file_(file_descriptor),
    close_on_delete_(false),
    is_closed_(false),
    errno_(0) {
}